

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O0

Bmcg_Man_t * Bmcg_ManStart(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  bmcg_sat_solver *pbVar4;
  int local_28;
  int local_24;
  int Lit;
  int i;
  Bmcg_Man_t *p;
  Bmc_AndPar_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  p = (Bmcg_Man_t *)pPars;
  pPars_local = (Bmc_AndPar_t *)pGia;
  _Lit = (Bmcg_Man_t *)calloc(1,0x3a8);
  local_28 = Abc_Var2Lit(0,1);
  iVar1 = Gia_ManRegNum((Gia_Man_t *)pPars_local);
  if (0 < iVar1) {
    _Lit->pPars = (Bmc_AndPar_t *)p;
    _Lit->pGia = (Gia_Man_t *)pPars_local;
    iVar1 = Gia_ManObjNum((Gia_Man_t *)pPars_local);
    pGVar2 = Gia_ManStart(iVar1 * 3);
    _Lit->pFrames = pGVar2;
    Gia_ManHashStart(_Lit->pFrames);
    _Lit->pClean = (Gia_Man_t *)0x0;
    Vec_PtrGrow(&_Lit->vGia2Fr,1000);
    pVVar3 = &_Lit->vFr2Sat;
    iVar1 = Gia_ManCiNum((Gia_Man_t *)pPars_local);
    Vec_IntGrow(pVVar3,iVar1 * 3);
    Vec_IntPush(&_Lit->vFr2Sat,0);
    pVVar3 = &_Lit->vCiMap;
    iVar1 = Gia_ManCiNum((Gia_Man_t *)pPars_local);
    Vec_IntGrow(pVVar3,iVar1 * 3);
    for (local_24 = 0; local_24 < _Lit->pPars->nProcs; local_24 = local_24 + 1) {
      pbVar4 = bmcg_sat_solver_start();
      _Lit->pSats[local_24] = pbVar4;
      bmcg_sat_solver_addvar(_Lit->pSats[local_24]);
      bmcg_sat_solver_addclause(_Lit->pSats[local_24],&local_28,1);
      bmcg_sat_solver_set_stop(_Lit->pSats[local_24],&_Lit->fStopNow);
    }
    _Lit->nSatVars = 1;
    return _Lit;
  }
  __assert_fail("Gia_ManRegNum(pGia) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                ,0x4d,"Bmcg_Man_t *Bmcg_ManStart(Gia_Man_t *, Bmc_AndPar_t *)");
}

Assistant:

Bmcg_Man_t * Bmcg_ManStart( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmcg_Man_t * p = ABC_CALLOC( Bmcg_Man_t, 1 ); 
    int i, Lit = Abc_Var2Lit( 0, 1 );
//    opts.conf_limit = pPars->nConfLimit;
    assert( Gia_ManRegNum(pGia) > 0 );
    p->pPars   = pPars;
    p->pGia    = pGia;
    p->pFrames = Gia_ManStart( 3*Gia_ManObjNum(pGia) );  Gia_ManHashStart(p->pFrames);
    p->pClean  = NULL;
//    Vec_PtrFill( &p->vGia2Fr, Gia_ManCountTents(pGia)+1, NULL );
//    for ( i = 0; i < Vec_PtrSize(&p->vGia2Fr); i++ )
//        Vec_PtrWriteEntry( &p->vGia2Fr, i, ABC_FALLOC(int, Gia_ManObjNum(pGia)) );
    Vec_PtrGrow( &p->vGia2Fr, 1000 );  
    Vec_IntGrow( &p->vFr2Sat, 3*Gia_ManCiNum(pGia) );  
    Vec_IntPush( &p->vFr2Sat, 0 );
    Vec_IntGrow( &p->vCiMap, 3*Gia_ManCiNum(pGia) );
    for ( i = 0; i < p->pPars->nProcs; i++ )
    {
        p->pSats[i] = bmcg_sat_solver_start();  
//        p->pSats[i]->SolverType = i;
        bmcg_sat_solver_addvar( p->pSats[i] );
        bmcg_sat_solver_addclause( p->pSats[i], &Lit, 1 );  
        bmcg_sat_solver_set_stop( p->pSats[i], &p->fStopNow );
    }
    p->nSatVars = 1;
    return p;
}